

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PClass::ReadValue(PClass *this,FArchive *ar,void *addr)

{
  bool bVar1;
  PClass *pPVar2;
  bool bVar3;
  BYTE tag;
  PClass *type;
  
  FArchive::operator<<(ar,&tag);
  if (tag == 0x12) {
    FArchive::UserReadClass(ar,&type);
    bVar3 = false;
    while (pPVar2 = this, type != (PClass *)0x0) {
      for (; (pPVar2 != (PClass *)0x0 && (pPVar2 != type)); pPVar2 = pPVar2->ParentClass) {
      }
      if (pPVar2 == (PClass *)0x0) {
        DPrintf(1,"Unknown superclass %s of class %s\n",
                FName::NameData.NameArray[(type->super_PStruct).super_PNamedType.TypeName.Index].
                Text,FName::NameData.NameArray
                     [(this->super_PStruct).super_PNamedType.TypeName.Index].Text);
        PType::SkipValue(ar,0xe);
      }
      else {
        bVar1 = PStruct::ReadFields(&type->super_PStruct,ar,addr);
        bVar3 = (bool)(bVar3 | bVar1);
      }
      FArchive::UserReadClass(ar,&type);
    }
  }
  else {
    PType::SkipValue(ar,(uint)tag);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PClass::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag != VAL_Class)
	{
		SkipValue(ar, tag);
		return false;
	}
	else
	{
		bool readsomething = false;
		PClass *type;
		for (ar.UserReadClass(type); type != NULL; ar.UserReadClass(type))
		{
			// Only read it if the type is related to this one.
			const PClass *parent;
			for (parent = this; parent != NULL; parent = parent->ParentClass)
			{
				if (parent == type)
				{
					break;
				}
			}
			if (parent != NULL)
			{
				readsomething |= type->ReadFields(ar, addr);
			}
			else
			{
				DPrintf(DMSG_ERROR, "Unknown superclass %s of class %s\n",
					type->TypeName.GetChars(), TypeName.GetChars());
				SkipValue(ar, VAL_Struct);
			}
		}
		return readsomething;
	}
}